

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock_gl_engine.cpp
# Opt level: O2

void __thiscall
polyscope::render::backend_openGL_mock::GLShaderProgram::setIndex
          (GLShaderProgram *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *indices)

{
  uint uVar1;
  invalid_argument *this_00;
  uint *puVar2;
  uint *puVar3;
  
  if ((this->super_ShaderProgram).useIndex == false) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (this_00,"Tried to setIndex() when program drawMode does not use indexed drawing");
LAB_001e282d:
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  if ((this->super_ShaderProgram).usePrimitiveRestart == false) {
    puVar2 = (indices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
  }
  else {
    puVar2 = (indices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->super_ShaderProgram).primitiveRestartIndexSet == false) {
      puVar3 = puVar2;
      do {
        if (puVar3 == (indices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                      _M_impl.super__Vector_impl_data._M_finish) goto LAB_001e2846;
        uVar1 = *puVar3;
        puVar3 = puVar3 + 1;
      } while (uVar1 < 100000000);
      this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument
                (this_00,
                 "An unusual index was passed, but setPrimitiveRestartIndex() has not been called.")
      ;
      goto LAB_001e282d;
    }
  }
LAB_001e2846:
  (this->super_ShaderProgram).indexSize =
       (long)(indices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish - (long)puVar2 >> 2;
  return;
}

Assistant:

void GLShaderProgram::setIndex(std::vector<unsigned int>& indices) {
  // (This version is typically used for indexed lines)

  if (!useIndex) {
    throw std::invalid_argument("Tried to setIndex() when program drawMode does not use indexed "
                                "drawing");
  }

  // Catch some cases where we forget to specify the restart index.
  // It would be nice to do a more complete check involving the data buffer, but this is simple
  // and catches most mistakes.
  if (usePrimitiveRestart && !primitiveRestartIndexSet) {
    unsigned int bigThresh = 99999999;
    for (unsigned int x : indices) {
      if (x > bigThresh) {
        throw std::invalid_argument("An unusual index was passed, but setPrimitiveRestartIndex() has not been called.");
      }
    }
  }
  indexSize = indices.size();
}